

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChSolverADMM.cpp
# Opt level: O3

double __thiscall chrono::ChSolverADMM::Solve(ChSolverADMM *this,ChSystemDescriptor *sysd)

{
  double extraout_XMM0_Qa;
  
  (*(this->super_ChIterativeSolverVI).super_ChIterativeSolver._vptr_ChIterativeSolver
    [(ulong)(this->acceleration == NESTEROV) + 9])();
  return extraout_XMM0_Qa;
}

Assistant:

double ChSolverADMM::Solve(ChSystemDescriptor& sysd) {

    switch (this->acceleration) {
    case AdmmAcceleration::BASIC:
        return _SolveBasic(sysd);
    case AdmmAcceleration::NESTEROV:
        return _SolveFast(sysd);
    default: 
        return _SolveBasic(sysd);
    }
}